

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2sSpecialFloatTests.cpp
# Opt level: O2

int __thiscall
deqp::gles2::Stress::anon_unknown_0::TextureSamplerCase::init
          (TextureSamplerCase *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *poVar1;
  TestType TVar2;
  int iVar3;
  deUint32 dVar4;
  int extraout_EAX;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  long lVar5;
  NotSupportedError *pNVar6;
  int x;
  long lVar7;
  EVP_PKEY_CTX *ctx_00;
  uint uVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  bool bVar12;
  allocator<char> local_209;
  GLuint *local_208;
  GLint maxVertexTexUnits;
  undefined4 uStack_1fc;
  TextureSamplerCase *local_1e0;
  GLint maxTextureSize;
  Random rnd;
  undefined1 local_1b0 [384];
  undefined4 extraout_var_01;
  
  ctx_00 = (EVP_PKEY_CTX *)&maxTextureSize;
  maxTextureSize = 0;
  iVar3 = (*((this->super_RenderCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3]
          )();
  (**(code **)(CONCAT44(extraout_var,iVar3) + 0x868))(0xd33);
  if (maxTextureSize < 0x80) {
    pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&maxVertexTexUnits,"GL_MAX_TEXTURE_SIZE must be at least ",&local_209);
    de::toString<int>((string *)&rnd,&Stress::(anonymous_namespace)::TEST_TEXTURE_SIZE);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_1b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &maxVertexTexUnits,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&rnd);
    tcu::NotSupportedError::NotSupportedError(pNVar6,(string *)local_1b0);
    __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (*(int *)&(this->super_RenderCase).field_0x84 == 0) {
    ctx_00 = (EVP_PKEY_CTX *)&maxVertexTexUnits;
    maxVertexTexUnits = 0;
    iVar3 = (*((this->super_RenderCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext
              [3])();
    (**(code **)(CONCAT44(extraout_var_00,iVar3) + 0x868))(0x8b4c);
    if (maxVertexTexUnits < 1) {
      pNVar6 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_1b0,"GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS must be at least 1",
                 (allocator<char> *)&rnd);
      tcu::NotSupportedError::NotSupportedError(pNVar6,(string *)local_1b0);
      __cxa_throw(pNVar6,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
  }
  RenderCase::init(&this->super_RenderCase,ctx_00);
  iVar3 = (*((this->super_RenderCase).super_TestCase.m_context)->m_renderCtx->_vptr_RenderContext[3]
          )();
  lVar5 = CONCAT44(extraout_var_01,iVar3);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&maxVertexTexUnits,0x10000,
             (allocator_type *)local_1b0);
  deRandom_init(&rnd.m_rnd,0x3039);
  local_208 = &this->m_textureID;
  (**(code **)(lVar5 + 0x6f8))(1);
  lVar11 = 0;
  local_1e0 = this;
  for (lVar7 = 0; lVar7 != 0x80; lVar7 = lVar7 + 1) {
    lVar10 = 0x80;
    lVar9 = lVar11;
    while (bVar12 = lVar10 != 0, lVar10 = lVar10 + -1, bVar12) {
      dVar4 = deRandom_getUint32(&rnd.m_rnd);
      *(char *)(CONCAT44(uStack_1fc,maxVertexTexUnits) + lVar9) = (char)dVar4;
      *(undefined1 *)(CONCAT44(uStack_1fc,maxVertexTexUnits) + 1 + lVar9) = 0xff;
      dVar4 = deRandom_getUint32(&rnd.m_rnd);
      *(char *)(CONCAT44(uStack_1fc,maxVertexTexUnits) + 2 + lVar9) = (char)dVar4;
      *(undefined1 *)(CONCAT44(uStack_1fc,maxVertexTexUnits) + 3 + lVar9) = 0xff;
      lVar9 = lVar9 + 4;
    }
    lVar11 = lVar11 + 0x200;
  }
  TVar2 = local_1e0->m_testType;
  if (TVar2 == TEST_TEX_COORD) {
    local_1b0._0_8_ =
         ((local_1e0->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Creating a 2D texture with a test pattern.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar5 + 0xb8))(0xde1,*local_208);
    (**(code **)(lVar5 + 0x1310))
              (0xde1,0,0x1908,0x80,0x80,0,0x1908,0x1401,CONCAT44(uStack_1fc,maxVertexTexUnits));
    (**(code **)(lVar5 + 0x1360))(0xde1,0x2800,0x2601);
    (**(code **)(lVar5 + 0x1360))(0xde1,0x2801,0x2601);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    iVar3 = 0x42b;
  }
  else if (TVar2 == TEST_LOD) {
    local_1b0._0_8_ =
         ((local_1e0->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Creating a mipmapped 2D texture with a test pattern.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar5 + 0xb8))(0xde1,*local_208);
    for (iVar3 = 0; iVar3 != 8; iVar3 = iVar3 + 1) {
      uVar8 = 0x80 >> ((byte)iVar3 & 0x1f);
      (**(code **)(lVar5 + 0x1310))
                (0xde1,iVar3,0x1908,uVar8,uVar8,0,0x1908,0x1401,
                 CONCAT44(uStack_1fc,maxVertexTexUnits));
    }
    (**(code **)(lVar5 + 0x1360))(0xde1,0x2800,0x2601);
    (**(code **)(lVar5 + 0x1360))(0xde1,0x2801,0x2703);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    iVar3 = 0x438;
  }
  else {
    if (TVar2 != TEST_TEX_COORD_CUBE) goto LAB_00f6aed4;
    local_1b0._0_8_ =
         ((local_1e0->super_RenderCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx)->
         m_log;
    poVar1 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::operator<<((ostream *)poVar1,"Creating a cube map with a test pattern.");
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    (**(code **)(lVar5 + 0xb8))(0x8513,*local_208);
    for (lVar7 = 0; lVar7 != 0x18; lVar7 = lVar7 + 4) {
      (**(code **)(lVar5 + 0x1310))
                (*(undefined4 *)((long)init::faces + lVar7),0,0x1908,0x20,0x20,0,0x1908,0x1401,
                 CONCAT44(uStack_1fc,maxVertexTexUnits));
    }
    (**(code **)(lVar5 + 0x1360))(0x8513,0x2800,0x2601);
    (**(code **)(lVar5 + 0x1360))(0x8513,0x2801,0x2601);
    dVar4 = (**(code **)(lVar5 + 0x800))();
    iVar3 = 0x451;
  }
  glu::checkError(dVar4,"TextureSamplerCase::init",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles2/stress/es2sSpecialFloatTests.cpp"
                  ,iVar3);
LAB_00f6aed4:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&maxVertexTexUnits);
  return extraout_EAX;
}

Assistant:

void TextureSamplerCase::init (void)
{
	// requirements
	{
		GLint maxTextureSize = 0;
		m_context.getRenderContext().getFunctions().getIntegerv(GL_MAX_TEXTURE_SIZE, &maxTextureSize);
		if (maxTextureSize < TEST_TEXTURE_SIZE)
			throw tcu::NotSupportedError(std::string("GL_MAX_TEXTURE_SIZE must be at least ") + de::toString(TEST_TEXTURE_SIZE));
	}

	// vertex shader supports textures?
	if (m_type == TYPE_VERTEX)
	{
		GLint maxVertexTexUnits = 0;
		m_context.getRenderContext().getFunctions().getIntegerv(GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS, &maxVertexTexUnits);
		if (maxVertexTexUnits < 1)
			throw tcu::NotSupportedError("GL_MAX_VERTEX_TEXTURE_IMAGE_UNITS must be at least 1");
	}

	RenderCase::init();

	// gen texture
	{
		const glw::Functions&	gl		= m_context.getRenderContext().getFunctions();
		std::vector<deUint8>	texData	(TEST_TEXTURE_SIZE*TEST_TEXTURE_SIZE*4);
		de::Random				rnd		(12345);

		gl.genTextures(1, &m_textureID);

		for (int x = 0; x < TEST_TEXTURE_SIZE; ++x)
		for (int y = 0; y < TEST_TEXTURE_SIZE; ++y)
		{
			// RGBA8, green and alpha channel are always 255 for verification
			texData[(x * TEST_TEXTURE_SIZE + y) * 4 + 0] = rnd.getUint32() & 0xFF;
			texData[(x * TEST_TEXTURE_SIZE + y) * 4 + 1] = 0xFF;
			texData[(x * TEST_TEXTURE_SIZE + y) * 4 + 2] = rnd.getUint32() & 0xFF;
			texData[(x * TEST_TEXTURE_SIZE + y) * 4 + 3] = 0xFF;
		}

		if (m_testType == TEST_TEX_COORD)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Creating a 2D texture with a test pattern." << tcu::TestLog::EndMessage;

			gl.bindTexture(GL_TEXTURE_2D, m_textureID);
			gl.texImage2D(GL_TEXTURE_2D, 0, GL_RGBA, TEST_TEXTURE_SIZE, TEST_TEXTURE_SIZE, 0, GL_RGBA, GL_UNSIGNED_BYTE, &texData[0]);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
			GLU_EXPECT_NO_ERROR(gl.getError(), "TextureSamplerCase::init");
		}
		else if (m_testType == TEST_LOD)
		{
			m_testCtx.getLog() << tcu::TestLog::Message << "Creating a mipmapped 2D texture with a test pattern." << tcu::TestLog::EndMessage;

			gl.bindTexture(GL_TEXTURE_2D, m_textureID);

			for (int level = 0; (TEST_TEXTURE_SIZE >> level); ++level)
				gl.texImage2D(GL_TEXTURE_2D, level, GL_RGBA, TEST_TEXTURE_SIZE >> level, TEST_TEXTURE_SIZE >> level, 0, GL_RGBA, GL_UNSIGNED_BYTE, &texData[0]);

			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
			gl.texParameteri(GL_TEXTURE_2D, GL_TEXTURE_MIN_FILTER, GL_LINEAR_MIPMAP_LINEAR);
			GLU_EXPECT_NO_ERROR(gl.getError(), "TextureSamplerCase::init");
		}
		else if (m_testType == TEST_TEX_COORD_CUBE)
		{
			DE_STATIC_ASSERT(TEST_TEXTURE_CUBE_SIZE <= TEST_TEXTURE_SIZE);

			static const GLenum faces[] =
			{
				GL_TEXTURE_CUBE_MAP_POSITIVE_X,
				GL_TEXTURE_CUBE_MAP_POSITIVE_Y,
				GL_TEXTURE_CUBE_MAP_POSITIVE_Z,
				GL_TEXTURE_CUBE_MAP_NEGATIVE_X,
				GL_TEXTURE_CUBE_MAP_NEGATIVE_Y,
				GL_TEXTURE_CUBE_MAP_NEGATIVE_Z,
			};

			m_testCtx.getLog() << tcu::TestLog::Message << "Creating a cube map with a test pattern." << tcu::TestLog::EndMessage;

			gl.bindTexture(GL_TEXTURE_CUBE_MAP, m_textureID);

			for (int faceNdx = 0; faceNdx < DE_LENGTH_OF_ARRAY(faces); ++faceNdx)
				gl.texImage2D(faces[faceNdx], 0, GL_RGBA, TEST_TEXTURE_CUBE_SIZE, TEST_TEXTURE_CUBE_SIZE, 0, GL_RGBA, GL_UNSIGNED_BYTE, &texData[0]);

			gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MAG_FILTER, GL_LINEAR);
			gl.texParameteri(GL_TEXTURE_CUBE_MAP, GL_TEXTURE_MIN_FILTER, GL_LINEAR);
			GLU_EXPECT_NO_ERROR(gl.getError(), "TextureSamplerCase::init");
		}
		else
			DE_ASSERT(DE_FALSE);
	}
}